

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cps_conversion.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_26::cps_conversion_helper::treat_expressions(cps_conversion_helper *this)

{
  Expression *e_00;
  bool bVar1;
  reference pvVar2;
  runtime_error *prVar3;
  Expression *e;
  cps_conversion_state cps_state;
  cps_conversion_helper *this_local;
  
  cps_state._40_8_ = this;
  do {
    bVar1 = std::
            vector<skiwi::(anonymous_namespace)::cps_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::cps_conversion_state>_>
            ::empty(&this->expressions_to_treat);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar2 = std::
             vector<skiwi::(anonymous_namespace)::cps_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::cps_conversion_state>_>
             ::back(&this->expressions_to_treat);
    cps_conversion_state::cps_conversion_state((cps_conversion_state *)&e,pvVar2);
    std::
    vector<skiwi::(anonymous_namespace)::cps_conversion_state,_std::allocator<skiwi::(anonymous_namespace)::cps_conversion_state>_>
    ::pop_back(&this->expressions_to_treat);
    e_00 = e;
    switch(cps_state.p_expr._0_4_) {
    case 0:
      bVar1 = std::
              holds_alternative<std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                        (e);
      if (bVar1) {
        cps_convert_literal_or_variable_or_nop_or_quote(this,e_00);
      }
      else {
        bVar1 = std::
                holds_alternative<skiwi::Variable,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          (e_00);
        if (bVar1) {
          cps_convert_literal_or_variable_or_nop_or_quote(this,e_00);
        }
        else {
          bVar1 = std::
                  holds_alternative<skiwi::Nop,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            (e_00);
          if (bVar1) {
            cps_convert_literal_or_variable_or_nop_or_quote(this,e_00);
          }
          else {
            bVar1 = std::
                    holds_alternative<skiwi::Quote,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              (e_00);
            if (bVar1) {
              cps_convert_literal_or_variable_or_nop_or_quote(this,e_00);
            }
            else {
              bVar1 = std::
                      holds_alternative<skiwi::Set,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                (e_00);
              if (bVar1) {
                cps_convert_set(this,e_00);
              }
              else {
                bVar1 = std::
                        holds_alternative<skiwi::If,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  (e_00);
                if (bVar1) {
                  cps_convert_if(this,e_00);
                }
                else {
                  bVar1 = std::
                          holds_alternative<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                    (e_00);
                  if (bVar1) {
                    cps_convert_begin(this,e_00);
                  }
                  else {
                    bVar1 = std::
                            holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                      (e_00);
                    if (bVar1) {
                      cps_convert_prim(this,e_00);
                    }
                    else {
                      bVar1 = std::
                              holds_alternative<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                        (e_00);
                      if (bVar1) {
                        cps_convert_foreign(this,e_00);
                      }
                      else {
                        bVar1 = std::
                                holds_alternative<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                          (e_00);
                        if (bVar1) {
                          cps_convert_lambda(this,e_00);
                        }
                        else {
                          bVar1 = std::
                                  holds_alternative<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                            (e_00);
                          if (bVar1) {
                            cps_convert_funcall(this,e_00);
                          }
                          else {
                            bVar1 = std::
                                    holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                              (e_00);
                            if (bVar1) {
                              cps_convert_let(this,e_00);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    case 1:
      bVar1 = std::
              holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                        (e);
      if (bVar1) {
        cps_convert_prim_nonsimple_step1
                  (this,e_00,
                   (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&cps_state.state);
      }
      else {
        bVar1 = std::
                holds_alternative<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          (e_00);
        if (bVar1) {
          cps_convert_begin_step1(this,e_00);
        }
        else {
          bVar1 = std::
                  holds_alternative<skiwi::Lambda,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            (e_00);
          if (bVar1) {
            cps_convert_lambda_step1(this,e_00);
          }
          else {
            bVar1 = std::
                    holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              (e_00);
            if (bVar1) {
              cps_convert_let_nonsimple_step1(this,e_00);
            }
            else {
              bVar1 = std::
                      holds_alternative<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                (e_00);
              if (bVar1) {
                cps_convert_funcall_step1
                          (this,e_00,
                           (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cps_state.state);
              }
              else {
                bVar1 = std::
                        holds_alternative<skiwi::Set,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  (e_00);
                if (bVar1) {
                  cps_convert_set_nonsimple_step1(this,e_00);
                }
                else {
                  bVar1 = std::
                          holds_alternative<skiwi::If,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                    (e_00);
                  if (bVar1) {
                    cps_convert_if_step1(this,e_00);
                  }
                  else {
                    bVar1 = std::
                            holds_alternative<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                      (e_00);
                    if (!bVar1) {
                      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar3,"Compiler error!: cps conversion: not implemented");
                      __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    cps_convert_foreign_nonsimple_step1
                              (this,e_00,
                               (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&cps_state.state);
                  }
                }
              }
            }
          }
        }
      }
      break;
    case 2:
      bVar1 = std::
              holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                        (e);
      if (bVar1) {
        cps_convert_prim_nonsimple_step2
                  (this,e_00,
                   (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&cps_state.state,
                   (uint32_t)
                   cps_state.nonsimple_vars.
                   super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        bVar1 = std::
                holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          (e_00);
        if (bVar1) {
          cps_convert_let_nonsimple_step2
                    (this,e_00,
                     (uint32_t)
                     cps_state.nonsimple_vars.
                     super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          bVar1 = std::
                  holds_alternative<skiwi::Begin,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            (e_00);
          if (bVar1) {
            cps_convert_begin_step2(this);
          }
          else {
            bVar1 = std::
                    holds_alternative<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              (e_00);
            if (bVar1) {
              cps_convert_funcall_step2
                        (this,e_00,
                         (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cps_state.state,
                         (uint32_t)
                         cps_state.nonsimple_vars.
                         super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              bVar1 = std::
                      holds_alternative<skiwi::If,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                (e_00);
              if (bVar1) {
                cps_convert_if_step2(this);
              }
              else {
                bVar1 = std::
                        holds_alternative<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                                  (e_00);
                if (!bVar1) {
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar3,"Compiler error!: cps conversion: not implemented");
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                cps_convert_foreign_nonsimple_step2
                          (this,e_00,
                           (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cps_state.state,
                           (uint32_t)
                           cps_state.nonsimple_vars.
                           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
          }
        }
      }
      break;
    case 3:
      bVar1 = std::
              holds_alternative<skiwi::PrimitiveCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                        (e);
      if (bVar1) {
        cps_convert_prim_nonsimple_step3
                  (this,e_00,
                   (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&cps_state.state);
      }
      else {
        bVar1 = std::
                holds_alternative<skiwi::Let,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                          (e_00);
        if (bVar1) {
          cps_convert_let_nonsimple_step3
                    (this,e_00,
                     (uint32_t)
                     cps_state.nonsimple_vars.
                     super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          bVar1 = std::
                  holds_alternative<skiwi::FunCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                            (e_00);
          if (bVar1) {
            cps_convert_funcall_step3(this,e_00);
          }
          else {
            bVar1 = std::
                    holds_alternative<skiwi::ForeignCall,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                              (e_00);
            if (!bVar1) {
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar3,"Compiler error!: cps conversion: not implemented");
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            cps_convert_foreign_nonsimple_step3
                      (this,e_00,
                       (vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&cps_state.state);
          }
        }
      }
    }
    cps_conversion_state::~cps_conversion_state((cps_conversion_state *)&e);
  } while( true );
}

Assistant:

void treat_expressions()
      {
      while (!expressions_to_treat.empty())
        {
        cps_conversion_state cps_state = expressions_to_treat.back();
        expressions_to_treat.pop_back();
        Expression& e = *cps_state.p_expr;
        switch (cps_state.state)
          {
          case cps_conversion_state::e_conversion_state::T_INIT:
          {
          if (std::holds_alternative<Literal>(e))
            {
            cps_convert_literal_or_variable_or_nop_or_quote(e);
            }
          else if (std::holds_alternative<Variable>(e))
            {
            cps_convert_literal_or_variable_or_nop_or_quote(e);
            }
          else if (std::holds_alternative<Nop>(e))
            {
            cps_convert_literal_or_variable_or_nop_or_quote(e);
            }
          else if (std::holds_alternative<Quote>(e))
            {
            cps_convert_literal_or_variable_or_nop_or_quote(e);
            }
          else if (std::holds_alternative<Set>(e))
            {
            cps_convert_set(e);
            }
          else if (std::holds_alternative<If>(e))
            {
            cps_convert_if(e);
            }
          else if (std::holds_alternative<Begin>(e))
            {
            cps_convert_begin(e);
            }
          else if (std::holds_alternative<PrimitiveCall>(e))
            {
            cps_convert_prim(e);
            }
          else if (std::holds_alternative<ForeignCall>(e))
            {
            cps_convert_foreign(e);
            }
          else if (std::holds_alternative<Lambda>(e))
            {
            cps_convert_lambda(e);
            }
          else if (std::holds_alternative<FunCall>(e))
            {
            cps_convert_funcall(e);
            }
          else if (std::holds_alternative<Let>(e))
            {
            cps_convert_let(e);
            }
          break;
          }
          case cps_conversion_state::e_conversion_state::T_STEP_1:
          {
          if (std::holds_alternative<PrimitiveCall>(e))
            {
            cps_convert_prim_nonsimple_step1(e, cps_state.nonsimple_vars);
            }
          else if (std::holds_alternative<Begin>(e))
            {
            cps_convert_begin_step1(e);
            }
          else if (std::holds_alternative<Lambda>(e))
            {
            cps_convert_lambda_step1(e);
            }
          else if (std::holds_alternative<Let>(e))
            {
            cps_convert_let_nonsimple_step1(e);
            }
          else if (std::holds_alternative<FunCall>(e))
            {
            cps_convert_funcall_step1(e, cps_state.nonsimple_vars);
            }
          else if (std::holds_alternative<Set>(e))
            {
            cps_convert_set_nonsimple_step1(e);
            }
          else if (std::holds_alternative<If>(e))
            {
            cps_convert_if_step1(e);
            }
          else if (std::holds_alternative<ForeignCall>(e))
            {
            cps_convert_foreign_nonsimple_step1(e, cps_state.nonsimple_vars);
            }
          else
            {
            throw std::runtime_error("Compiler error!: cps conversion: not implemented");
            }
          break;
          }
          case cps_conversion_state::e_conversion_state::T_STEP_2:
          {
          if (std::holds_alternative<PrimitiveCall>(e))
            {
            cps_convert_prim_nonsimple_step2(e, cps_state.nonsimple_vars, cps_state.index);
            }
          else if (std::holds_alternative<Let>(e))
            {
            cps_convert_let_nonsimple_step2(e, cps_state.index);
            }
          else if (std::holds_alternative<Begin>(e))
            {
            cps_convert_begin_step2();
            }
          else if (std::holds_alternative<FunCall>(e))
            {
            cps_convert_funcall_step2(e, cps_state.nonsimple_vars, cps_state.index);
            }
          else if (std::holds_alternative<If>(e))
            {
            cps_convert_if_step2();
            }
          else if (std::holds_alternative<ForeignCall>(e))
            {
            cps_convert_foreign_nonsimple_step2(e, cps_state.nonsimple_vars, cps_state.index);
            }
          else
            {
            throw std::runtime_error("Compiler error!: cps conversion: not implemented");
            }
          break;
          }
          case cps_conversion_state::e_conversion_state::T_STEP_3:
          {
          if (std::holds_alternative<PrimitiveCall>(e))
            {
            cps_convert_prim_nonsimple_step3(e, cps_state.nonsimple_vars);
            }
          else if (std::holds_alternative<Let>(e))
            {
            cps_convert_let_nonsimple_step3(e, cps_state.index);
            }
          else if (std::holds_alternative<FunCall>(e))
            {
            cps_convert_funcall_step3(e);
            }
          else if (std::holds_alternative<ForeignCall>(e))
            {
            cps_convert_foreign_nonsimple_step3(e, cps_state.nonsimple_vars);
            }
          else
            {
            throw std::runtime_error("Compiler error!: cps conversion: not implemented");
            }
          break;
          }
          } // switch
        }
      }